

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

Validity * __thiscall
capnp::compiler::CompilerMain::verifyRequirements
          (Validity *__return_storage_ptr__,CompilerMain *this,Format format)

{
  bool bVar1;
  ArrayPtr<const_char> local_38;
  Array<char> local_28;
  
  bVar1 = false;
  if ((format - TEXT < 2) &&
     ((this->rootType).super_Schema.raw == (RawBrandedSchema *)(capnp::_::NULL_STRUCT_SCHEMA + 0x48)
     )) {
    local_38 = (ArrayPtr<const_char>)toString(this,format);
    kj::str<char_const(&)[25],kj::StringPtr>
              ((String *)&local_28,(kj *)"format requires schema: ",(char (*) [25])&local_38,
               (StringPtr *)&local_38);
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr = local_28.ptr;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ = local_28.size_;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer = local_28.disposer;
    local_28.ptr = (char *)0x0;
    local_28.size_ = 0;
    kj::Array<char>::~Array(&local_28);
    bVar1 = true;
  }
  (__return_storage_ptr__->errorMessage).ptr.isSet = bVar1;
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity verifyRequirements(Format format) {
    if ((format == Format::TEXT || format == Format::JSON) && rootType == StructSchema()) {
      return kj::str("format requires schema: ", toString(format));
    } else {
      return true;
    }
  }